

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_recall_monster(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  monster_race *pmVar3;
  monster_lore_conflict *lore;
  int local_84;
  wchar_t i;
  monster_race *race_1;
  monster_race *race;
  char local_68 [7];
  char c;
  char s [80];
  wchar_t r_idx;
  command_conflict *cmd_local;
  
  s._76_4_ = ZEXT24(z_info->r_max);
  wVar2 = cmd_get_arg_number((command *)cmd,"index",(int *)(s + 0x4c));
  if (wVar2 != L'\0') {
    memset(local_68,0,0x50);
    _Var1 = get_com("Full recall for [a]ll monsters or [s]pecific monster? ",
                    (char *)((long)&race + 7));
    if (!_Var1) {
      return;
    }
    if ((race._7_1_ == 'a') || (race._7_1_ == 'A')) {
      s[0x4c] = -1;
      s[0x4d] = -1;
      s[0x4e] = -1;
      s[0x4f] = -1;
    }
    else {
      if ((race._7_1_ != 's') && (race._7_1_ != 'S')) {
        return;
      }
      _Var1 = get_string("Which monster? ",local_68,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_68,(int *)(s + 0x4c));
      if ((!_Var1) && (pmVar3 = lookup_monster(local_68), pmVar3 != (monster_race *)0x0)) {
        s._76_4_ = pmVar3->ridx;
      }
    }
    cmd_set_arg_number((command *)cmd,"index",s._76_4_);
  }
  if (((int)s._76_4_ < 0) || ((int)(uint)z_info->r_max <= (int)s._76_4_)) {
    if (s._76_4_ == -1) {
      for (local_84 = 0; local_84 < (int)(uint)z_info->r_max; local_84 = local_84 + 1) {
        cheat_monster_lore(r_info + local_84,(monster_lore_conflict *)(l_list + local_84));
      }
    }
    else {
      msg("No monster found.");
    }
  }
  else {
    pmVar3 = r_info + (int)s._76_4_;
    lore = get_lore(pmVar3);
    cheat_monster_lore(pmVar3,lore);
  }
  return;
}

Assistant:

void do_cmd_wiz_recall_monster(struct command *cmd)
{
	int r_idx = z_info->r_max;

	if (cmd_get_arg_number(cmd, "index", &r_idx) != CMD_OK) {
		char s[80] = "";
		char c;

		if (!get_com("Full recall for [a]ll monsters or [s]pecific monster? ", &c)) return;
		if (c == 'a' || c == 'A') {
			r_idx = -1;
		} else if (c == 's' || c == 'S') {
			if (!get_string("Which monster? ", s, sizeof(s)))
				return;
			if (!get_int_from_string(s, &r_idx)) {
				const struct monster_race *race =
					lookup_monster(s);

				if (race) {
					r_idx = race->ridx;
				}
			}
		} else {
			return;
		}
		cmd_set_arg_number(cmd, "index", r_idx);
	}

	if (r_idx >= 0 && r_idx < z_info->r_max) {
		const struct monster_race *race = &r_info[r_idx];

		cheat_monster_lore(race, get_lore(race));
	} else if (r_idx == -1) {
		int i;

		for (i = 0; i < z_info->r_max; i++) {
			cheat_monster_lore(&r_info[i], &l_list[i]);
		}
	} else {
		msg("No monster found.");
	}
}